

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

lattice_site __thiscall
sisl::body_centered_cubic<char>::get_dimensions(body_centered_cubic<char> *this)

{
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  lattice_site lVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_30;
  
  local_30.m_xpr._0_4_ = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<int,__1,_1,_0,__1,_1> *)this,(int *)&local_30);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_30,(Matrix<int,__1,_1,_0,__1,_1> *)this,(Scalar *)(in_RSI + 8));
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_30,(Scalar *)(in_RSI + 0xc));
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
            (this_00,(Scalar *)(in_RSI + 0x10));
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::finished(&local_30);
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const lattice_site get_dimensions() const {
            lattice_site s(3);
            s << _nx , _ny , _nz ;
            return s;
        }